

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gps_survey.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  string sStack_a28;
  tsip gps;
  
  rc = 0;
  iVar1 = proc_args(argc,argv);
  if (iVar1 != 0) {
    if (iVar1 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cout," ***(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3,") error encountered in parms***");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = 3;
    __cxa_throw(puVar4,&unsigned_long::typeinfo,0);
  }
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&gps,
             "gps is on port: %s");
  f = boost::io::detail::
      feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string&>
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&gps,
                 &gps_port_abi_cxx11_);
  pbVar2 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,f);
  std::endl<char,std::char_traits<char>>(pbVar2);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&gps);
  std::__cxx11::string::string((string *)&sStack_a28,(string *)&gps_port_abi_cxx11_);
  tsip::tsip(&gps,&sStack_a28,true);
  std::__cxx11::string::~string((string *)&sStack_a28);
  if (gps.port_status != false) {
    poVar3 = std::operator<<((ostream *)&std::cout,"setting survey_count to ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,survey_cnt);
    std::endl<char,std::char_traits<char>>(poVar3);
    tsip::set_survey_params(&gps,survey_cnt);
    poVar3 = std::operator<<((ostream *)&std::cout,"starting self survey for ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,survey_cnt);
    poVar3 = std::operator<<(poVar3," position readings");
    std::endl<char,std::char_traits<char>>(poVar3);
    tsip::start_self_survey(&gps);
    if (0 < wait_sec) {
      poVar3 = std::operator<<((ostream *)&std::cout,"waiting for ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,wait_sec);
      poVar3 = std::operator<<(poVar3," seconds.");
      std::endl<char,std::char_traits<char>>(poVar3);
      sleep(wait_sec);
      poVar3 = std::operator<<((ostream *)&std::cout,"OK...done!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    tsip::~tsip(&gps);
    return rc;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Unable to open port - terminating run");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 99;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

int main(int argc,char **argv) {
	rc = 0;
	
	try {
		int rtn = proc_args(argc,argv);
		if (rtn > EXIT_SUCCESS) {
			if (rtn != EXIT_HELP) {
				cout << " ***(" << rtn << ") error encountered in parms***" << endl << endl;
			}
			throw ERROR_IN_COMMAND_LINE;
		}
		
		//test_prt(argc,argv);

		//instantiate gps class
		cout << boost::format("gps is on port: %s") % gps_port<< endl;
		tsip gps(gps_port);
		
		if (!gps.port_status) {
			cout << "Unable to open port - terminating run" << endl;
			throw 99;
		}
		
		bool rc;
		//set the survey count
		cout << "setting survey_count to " << survey_cnt << endl;
		rc = gps.set_survey_params(survey_cnt);
		
		//start self survey
		cout << "starting self survey for " << survey_cnt << " position readings" << endl;
		rc = gps.start_self_survey();
		
		//wait for survey to finish
		if (wait_sec > 0) {
			cout << "waiting for " << wait_sec << " seconds." << endl;
			sleep(wait_sec);
			cout << "OK...done!" << endl;
		}
		
		rc = 0;
	} 
	catch(exception& e) {
		cerr << "Unhandled Exception reached the top of main: "
		     << e.what() << ", application will now exit" << endl;
		rc = ERROR_UNHANDLED_EXCEPTION;
		return ERROR_UNHANDLED_EXCEPTION;
	} 
	catch (int n) {
		rc = n;
	}
	catch(...) {
	}
	
	return rc;
}